

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.hpp
# Opt level: O2

string * __thiscall
CLI::Formatter::make_subcommand_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *sub)

{
  string local_1e0;
  string local_1c0;
  stringstream out;
  ostream local_190 [376];
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)&out);
  App::get_display_name_abi_cxx11_(&local_1c0,sub,true);
  ::std::__cxx11::string::string((string *)&local_1e0,(string *)&sub->description_);
  detail::format_help(local_190,&local_1c0,&local_1e0,(this->super_FormatterBase).column_width_);
  ::std::__cxx11::string::~string((string *)&local_1e0);
  ::std::__cxx11::string::~string((string *)&local_1c0);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_subcommand(const App *sub) const {
    std::stringstream out;
    detail::format_help(out, sub->get_display_name(true), sub->get_description(), column_width_);
    return out.str();
}